

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O2

X509_ATTRIBUTE * X509_REQ_get_attr(X509_REQ *req,int loc)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  X509_ATTRIBUTE *pXVar2;
  
  sk = (OPENSSL_STACK *)req->req_info->attributes;
  if (-1 < loc && sk != (OPENSSL_STACK *)0x0) {
    sVar1 = OPENSSL_sk_num(sk);
    if ((uint)loc < sVar1) {
      pXVar2 = (X509_ATTRIBUTE *)
               OPENSSL_sk_value((OPENSSL_STACK *)req->req_info->attributes,(ulong)(uint)loc);
      return pXVar2;
    }
  }
  return (X509_ATTRIBUTE *)0x0;
}

Assistant:

X509_ATTRIBUTE *X509_REQ_get_attr(const X509_REQ *req, int loc) {
  if (req->req_info->attributes == NULL || loc < 0 ||
      sk_X509_ATTRIBUTE_num(req->req_info->attributes) <= (size_t)loc) {
    return NULL;
  }
  return sk_X509_ATTRIBUTE_value(req->req_info->attributes, loc);
}